

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Vec_Wec_t * Abc_GiaSynthesize(Vec_Ptr_t *vGias,Gia_Man_t *pMulti)

{
  Abc_Obj_t *pObj;
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Frame_t *pAVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  Vec_Int_t *p;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  
  pAVar2 = Abc_NtkCreateFromGias("top",vGias,pMulti);
  uVar9 = 0;
  pAVar3 = Abc_FrameReadGlobalFrame();
  Abc_FrameReplaceCurrentNetwork(pAVar3,pAVar2);
  pAVar3 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar3,
                     "compress2rs; dch; map -a;  strash; compress2rs; dch; map -a;  strash; compress2rs; dch; map -a"
                    );
  pAVar3 = Abc_FrameReadGlobalFrame();
  pAVar2 = Abc_FrameReadNtk(pAVar3);
  pVVar6 = pAVar2->vPis;
  iVar8 = pVVar6->nSize;
  iVar12 = pAVar2->nObjCounts[7] + iVar8;
  iVar1 = pAVar2->vPos->nSize;
  iVar11 = iVar12 + iVar1;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < (iVar1 + iVar12) - 1U) {
    iVar7 = iVar11;
  }
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar11;
  if (0 < iVar8) {
    uVar9 = 0;
    do {
      *(int *)((long)pVVar6->pArray[uVar9] + 0x40) = (int)uVar9;
      uVar9 = uVar9 + 1;
      pVVar6 = pAVar2->vPis;
    } while ((long)uVar9 < (long)pVVar6->nSize);
  }
  pVVar6 = pAVar2->vObjs;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar6->pArray[lVar10];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        iVar8 = (int)uVar9;
        if ((iVar8 < 0) || (iVar11 <= iVar8)) goto LAB_0087d57e;
        p = pVVar5 + (uVar9 & 0xffffffff);
        iVar1 = Abc_GateToType(pObj);
        Vec_IntPush(p,iVar1);
        Vec_IntPush(p,iVar8);
        if (0 < (pObj->vFanins).nSize) {
          lVar13 = 0;
          do {
            Vec_IntPush(p,*(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar13]] +
                                  0x40));
            lVar13 = lVar13 + 1;
          } while (lVar13 < (pObj->vFanins).nSize);
        }
        (pObj->field_6).iTemp = iVar8;
        uVar9 = (ulong)(iVar8 + 1);
        pVVar6 = pAVar2->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
  }
  iVar8 = (int)uVar9;
  pVVar6 = pAVar2->vPos;
  if (pVVar6->nSize < 1) {
    iVar1 = pVVar4->nSize;
  }
  else {
    lVar10 = (uVar9 & 0xffffffff) << 4;
    lVar13 = 0;
    do {
      if ((iVar8 < 0) || (iVar1 = pVVar4->nSize, iVar1 <= iVar8 + (int)lVar13)) {
LAB_0087d57e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = (Vec_Int_t *)((long)&pVVar4->pArray->nCap + lVar10);
      iVar7 = *(int *)(*(long *)(*(long *)(*(long *)(*pVVar6->pArray[lVar13] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar6->pArray[lVar13] + 0x20) * 8) + 0x40);
      Vec_IntPush(pVVar5,0xb);
      Vec_IntPush(pVVar5,iVar7);
      lVar13 = lVar13 + 1;
      pVVar6 = pAVar2->vPos;
      lVar10 = lVar10 + 0x10;
    } while (lVar13 < pVVar6->nSize);
    iVar8 = iVar8 + (int)lVar13;
  }
  if (iVar1 == iVar8) {
    return pVVar4;
  }
  __assert_fail("Vec_WecSize(vRes) == iNode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xc60,"Vec_Wec_t *Abc_GiaSynthesize(Vec_Ptr_t *, Gia_Man_t *)");
}

Assistant:

Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti )
{
    Vec_Wec_t * vRes = NULL;
    Abc_Ntk_t * pNtk = Abc_NtkCreateFromGias( "top", vGias, pMulti );
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, iNode = 0;
    Abc_FrameReplaceCurrentNetwork( Abc_FrameReadGlobalFrame(), pNtk );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "compress2rs; dch; map -a;  strash; compress2rs; dch; map -a;  strash; compress2rs; dch; map -a" );
    pNtkNew = Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() );
    vRes = Vec_WecStart( Abc_NtkPiNum(pNtkNew) + Abc_NtkNodeNum(pNtkNew) + Abc_NtkPoNum(pNtkNew) );
    Abc_NtkForEachPi( pNtkNew, pObj, i )
        pObj->iTemp = iNode++;
    Abc_NtkForEachNode( pNtkNew, pObj, i )
    {
        Vec_Int_t * vNode = Vec_WecEntry(vRes, iNode);
        Vec_IntPush( vNode, Abc_GateToType(pObj) );
        Vec_IntPush( vNode, iNode );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vNode, pFanin->iTemp );
        pObj->iTemp = iNode++;
    }
    Abc_NtkForEachPo( pNtkNew, pObj, i )
        Vec_IntPushTwo( Vec_WecEntry(vRes, iNode++), ABC_OPER_BIT_BUF, Abc_ObjFanin0(pObj)->iTemp );
    assert( Vec_WecSize(vRes) == iNode );
    return vRes;
}